

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mod2sparse.c
# Opt level: O1

void mod2sparse_clear(mod2sparse *r)

{
  mod2block *__ptr;
  long lVar1;
  mod2entry *pmVar2;
  
  lVar1 = (long)r->n_rows;
  if (0 < lVar1) {
    pmVar2 = r->rows;
    do {
      pmVar2->down = pmVar2;
      pmVar2->up = pmVar2;
      pmVar2->right = pmVar2;
      pmVar2->left = pmVar2;
      pmVar2 = pmVar2 + 1;
      lVar1 = lVar1 + -1;
    } while (lVar1 != 0);
  }
  lVar1 = (long)r->n_cols;
  if (0 < lVar1) {
    pmVar2 = r->cols;
    do {
      pmVar2->down = pmVar2;
      pmVar2->up = pmVar2;
      pmVar2->right = pmVar2;
      pmVar2->left = pmVar2;
      pmVar2 = pmVar2 + 1;
      lVar1 = lVar1 + -1;
    } while (lVar1 != 0);
  }
  while (__ptr = r->blocks, __ptr != (mod2block *)0x0) {
    r->blocks = __ptr->next;
    free(__ptr);
  }
  return;
}

Assistant:

void mod2sparse_clear
( mod2sparse *r
)
{
  mod2block *b;
  mod2entry *e;
  int i, j;

  for (i = 0; i<mod2sparse_rows(r); i++)
  { e = &r->rows[i];
    e->left = e->right = e->up = e->down = e;
  }

  for (j = 0; j<mod2sparse_cols(r); j++)
  { e = &r->cols[j];
    e->left = e->right = e->up = e->down = e;
  }

  while (r->blocks!=0)
  { b = r->blocks;
    r->blocks = b->next;
    free(b);
  }
}